

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texsubimage3d_max_level(NegativeTestContext *ctx)

{
  deUint32 adVar1 [2];
  int iVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  deUint32 log2MaxTextureSize;
  deUint32 log2Max3DTextureSize;
  deUint32 textures [2];
  NegativeTestContext *ctx_local;
  
  textures = (deUint32  [2])ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,&log2MaxTextureSize);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0x806f,log2MaxTextureSize);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)textures,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0x8c1a,log2Max3DTextureSize);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)textures,0x8c1a,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0);
  iVar2 = NegativeTestContext::getInteger((NegativeTestContext *)textures,0x8073);
  local_1c = ::deLog2Floor32(iVar2);
  local_1c = local_1c + 1;
  iVar2 = NegativeTestContext::getInteger((NegativeTestContext *)textures,0xd33);
  local_20 = ::deLog2Floor32(iVar2);
  adVar1 = textures;
  local_20 = local_20 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_3D_TEXTURE_SIZE)."
             ,&local_41);
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glTexSubImage3D
            ((CallLogWrapper *)textures,0x806f,local_1c,0,0,0,0,0,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).",
             &local_79);
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glTexSubImage3D
            ((CallLogWrapper *)textures,0x8c1a,local_20,0,0,0,0,0,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)textures,2,&log2MaxTextureSize);
  return;
}

Assistant:

void texsubimage3d_max_level (NegativeTestContext& ctx)
{
	deUint32			textures[2];
	ctx.glGenTextures		(2, &textures[0]);
	ctx.glBindTexture		(GL_TEXTURE_3D, textures[0]);
	ctx.glTexImage3D		(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture		(GL_TEXTURE_2D_ARRAY, textures[1]);
	ctx.glTexImage3D		(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError			(GL_NO_ERROR);

	deUint32 log2Max3DTextureSize	= deLog2Floor32(ctx.getInteger(GL_MAX_3D_TEXTURE_SIZE)) + 1;
	deUint32 log2MaxTextureSize		= deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_3D_TEXTURE_SIZE).");
	ctx.glTexSubImage3D(GL_TEXTURE_3D, log2Max3DTextureSize, 0, 0, 0, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).");
	ctx.glTexSubImage3D(GL_TEXTURE_2D_ARRAY, log2MaxTextureSize, 0, 0, 0, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures	(2, &textures[0]);
}